

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::GRULayerParams::GRULayerParams(GRULayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GRULayerParams_003d4fe0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 3) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 3) = 0;
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  this->inputvectorsize_ = 0;
  this->updategatebiasvector_ = (WeightParams *)0x0;
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

GRULayerParams::GRULayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.GRULayerParams)
}